

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendCi(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManAppendObj(p);
  *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffff7fffffff | 0x80000000;
  *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffe0000000 | 0x1fffffff;
  uVar1 = Vec_IntSize(p->vCis);
  *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xe0000000ffffffff | ((ulong)uVar1 & 0x1fffffff) << 0x20;
  p_00 = p->vCis;
  iVar2 = Gia_ObjId(p,pObj_00);
  Vec_IntPush(p_00,iVar2);
  iVar2 = Gia_ObjId(p,pObj_00);
  return iVar2 << 1;
}

Assistant:

static inline int Gia_ManAppendCi( Gia_Man_t * p )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    pObj->fTerm = 1;
    pObj->iDiff0 = GIA_NONE;
    pObj->iDiff1 = Vec_IntSize( p->vCis );
    Vec_IntPush( p->vCis, Gia_ObjId(p, pObj) );
    return Gia_ObjId( p, pObj ) << 1;
}